

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void test1<nrg::AsyncExecutor<nrg::TimedExecution>>(char *title)

{
  pointer pcVar1;
  undefined8 uVar2;
  int iVar3;
  long *plVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ostream *poVar6;
  size_type *psVar7;
  int iVar8;
  int i;
  Executor<nrg::AsyncExecutor<nrg::TimedExecution>_> ex;
  optional<int> result;
  AsyncResult<int> ar1;
  AsyncResult<int> ar2;
  optional<int> res3;
  AsyncResult<int> ar4;
  AsyncResult<int> ar3;
  int local_104;
  Executor<nrg::AsyncExecutor<nrg::TimedExecution>_> local_100;
  undefined1 local_f0 [40];
  long *local_c8;
  long local_c0;
  long local_b8 [2];
  AsyncResult<int> local_a8;
  AsyncResult<int> local_98;
  undefined1 local_88 [24];
  AsyncResult<int> local_70;
  AsyncResult<int> local_60;
  ExceptionHandler local_50;
  
  local_50.super__Function_base._M_functor._8_8_ = 0;
  local_50.super__Function_base._M_functor._M_unused._M_object = onError;
  local_50._M_invoker =
       std::_Function_handler<void_(const_std::exception_&),_void_(*)(const_std::exception_&)>::
       _M_invoke;
  local_50.super__Function_base._M_manager =
       std::_Function_handler<void_(const_std::exception_&),_void_(*)(const_std::exception_&)>::
       _M_manager;
  nrg::Executor<nrg::AsyncExecutor<nrg::TimedExecution>_>::Executor(&local_100,&local_50);
  if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.super__Function_base._M_manager)
              ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  local_104 = 0x2a;
  local_a8.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)&std::cerr;
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8," -> start","");
  strlen(title);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)title);
  psVar7 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar7) {
    local_f0._16_8_ = *psVar7;
    local_f0._24_8_ = plVar4[3];
    local_f0._0_8_ = local_f0 + 0x10;
  }
  else {
    local_f0._16_8_ = *psVar7;
    local_f0._0_8_ = (size_type *)*plVar4;
  }
  local_f0._8_8_ = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
            (local_100.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<std::__cxx11::string>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)&local_a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
  if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  local_104 = local_104 + 1;
  nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
            (local_100.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print2,&local_104,(char (*) [7])"hallo1");
  local_104 = local_104 + 1;
  nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
            (local_100.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print2,&local_104,(char (*) [7])"hallo2");
  local_104 = local_104 + 1;
  nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
            (local_100.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print2,&local_104,(char (*) [7])"hallo3");
  local_104 = local_104 + 1;
  nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
            (local_100.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print2,&local_104,(char (*) [7])"hallo4");
  local_104 = local_104 + 1;
  nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
            (local_100.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print2,&local_104,(char (*) [7])"hallo5");
  local_104 = local_104 + 1;
  nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
            (local_100.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print2,&local_104,(char (*) [7])"hallo6");
  nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
            (local_100.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,exception);
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012ca90;
  p_Var5[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[1]._M_use_count = 0;
  p_Var5[1]._M_weak_count = 0;
  p_Var5[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[2]._M_use_count = 0;
  p_Var5[2]._M_weak_count = 0;
  p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[3]._M_use_count = 0;
  p_Var5[3]._M_weak_count = 0;
  p_Var5[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[4]._M_use_count = 0;
  p_Var5[4]._M_weak_count = 0;
  p_Var5[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[5]._M_use_count = 0;
  p_Var5[5]._M_weak_count = 0;
  p_Var5[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[6]._M_use_count = 0;
  p_Var5[6]._M_weak_count = 0;
  std::condition_variable::condition_variable((condition_variable *)&p_Var5[3]._M_use_count);
  *(undefined1 *)&p_Var5[6]._M_weak_count = 0;
  local_a8.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (Impl *)(p_Var5 + 1);
  local_a8.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012ca90;
  p_Var5[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[1]._M_use_count = 0;
  p_Var5[1]._M_weak_count = 0;
  p_Var5[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[2]._M_use_count = 0;
  p_Var5[2]._M_weak_count = 0;
  p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[3]._M_use_count = 0;
  p_Var5[3]._M_weak_count = 0;
  p_Var5[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[4]._M_use_count = 0;
  p_Var5[4]._M_weak_count = 0;
  p_Var5[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[5]._M_use_count = 0;
  p_Var5[5]._M_weak_count = 0;
  p_Var5[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[6]._M_use_count = 0;
  p_Var5[6]._M_weak_count = 0;
  std::condition_variable::condition_variable((condition_variable *)&p_Var5[3]._M_use_count);
  *(undefined1 *)&p_Var5[6]._M_weak_count = 0;
  local_98.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)(p_Var5 + 1);
  local_98.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012ca90;
  p_Var5[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[1]._M_use_count = 0;
  p_Var5[1]._M_weak_count = 0;
  p_Var5[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[2]._M_use_count = 0;
  p_Var5[2]._M_weak_count = 0;
  p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[3]._M_use_count = 0;
  p_Var5[3]._M_weak_count = 0;
  p_Var5[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[4]._M_use_count = 0;
  p_Var5[4]._M_weak_count = 0;
  p_Var5[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[5]._M_use_count = 0;
  p_Var5[5]._M_weak_count = 0;
  p_Var5[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[6]._M_use_count = 0;
  p_Var5[6]._M_weak_count = 0;
  std::condition_variable::condition_variable((condition_variable *)&p_Var5[3]._M_use_count);
  *(undefined1 *)&p_Var5[6]._M_weak_count = 0;
  local_f0._0_4_ = 0x2a;
  local_60.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)(p_Var5 + 1);
  local_60.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
            (local_100.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,withResult,&local_a8,&local_98,&local_60,(int *)local_f0);
  iVar3 = nrg::AsyncResult<int>::Impl::getResult
                    (local_a8.impl_.
                     super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  local_c8 = (long *)0x0;
  local_88._8_8_ = title;
  nrg::AsyncResult<int>::Impl::getResult<long,std::ratio<1l,1000l>>
            ((Impl *)local_f0,
             (duration<long,_std::ratio<1L,_1000L>_> *)
             local_98.impl_.
             super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  iVar8 = 0x2b;
  if (local_f0[4] != '\0') {
    iVar8 = local_f0._0_4_;
  }
  local_f0._0_8_ = (pointer)0x0;
  nrg::AsyncResult<int>::Impl::getResult<long,std::ratio<1l,1000l>>
            ((Impl *)local_88,
             (duration<long,_std::ratio<1L,_1000L>_> *)
             local_60.impl_.
             super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ar1: ",5);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,",  ar2: ",8);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,",  res3: ",9);
  iVar8 = 0;
  if (local_88[4] != '\0') {
    iVar8 = local_88._0_4_;
  }
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::chrono::_V2::steady_clock::now();
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012ca90;
  p_Var5[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[1]._M_use_count = 0;
  p_Var5[1]._M_weak_count = 0;
  p_Var5[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[2]._M_use_count = 0;
  p_Var5[2]._M_weak_count = 0;
  p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[3]._M_use_count = 0;
  p_Var5[3]._M_weak_count = 0;
  p_Var5[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[4]._M_use_count = 0;
  p_Var5[4]._M_weak_count = 0;
  p_Var5[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[5]._M_use_count = 0;
  p_Var5[5]._M_weak_count = 0;
  p_Var5[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[6]._M_use_count = 0;
  p_Var5[6]._M_weak_count = 0;
  std::condition_variable::condition_variable((condition_variable *)&p_Var5[3]._M_use_count);
  *(undefined1 *)&p_Var5[6]._M_weak_count = 0;
  local_70.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)(p_Var5 + 1);
  local_70.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
            (local_100.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,roundTrip,&local_70);
  local_c8 = (long *)0xc8;
  nrg::AsyncResult<int>::Impl::getResult<long,std::ratio<1l,1000l>>
            ((Impl *)local_f0,
             (duration<long,_std::ratio<1L,_1000L>_> *)
             local_70.impl_.
             super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::chrono::_V2::steady_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ar4 duration: ",0xe);
  poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ns\n",4);
  local_f0._0_8_ = &std::cerr;
  local_c8._0_1_ = (condition_variable)0xfb;
  local_c8._1_3_ = 0;
  nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
            (local_100.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<int>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)local_f0,
             (int *)&local_c8);
  pcVar1 = local_f0 + 0x10;
  local_f0._0_8_ = &std::cerr;
  local_c8._0_1_ = (condition_variable)0xfc;
  local_c8._1_3_ = 0;
  nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
            (local_100.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<int>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)local_f0,
             (int *)&local_c8);
  local_f0._0_8_ = &std::cerr;
  local_c8._0_1_ = (condition_variable)0xfd;
  local_c8._1_3_ = 0;
  nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
            (local_100.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<int>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)local_f0,
             (int *)&local_c8);
  local_f0._0_8_ = &std::cerr;
  local_c8._0_1_ = (condition_variable)0xfe;
  local_c8._1_3_ = 0;
  nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
            (local_100.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<int>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)local_f0,
             (int *)&local_c8);
  local_f0._0_8_ = &std::cerr;
  local_c8._0_1_ = (condition_variable)0xff;
  local_c8._1_3_ = 0;
  nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
            (local_100.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<int>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)local_f0,
             (int *)&local_c8);
  local_f0._0_8_ = &std::cerr;
  local_c8 = (long *)CONCAT44(local_c8._4_4_,0x100);
  nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
            (local_100.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<int>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)local_f0,
             (int *)&local_c8);
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"no timeout","");
  local_f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>((string *)local_f0,local_c8,local_c0 + (long)local_c8);
  local_f0._32_8_ = std::chrono::_V2::steady_clock::now();
  nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
            (local_100.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,(TimedCaller *)local_f0);
  if ((pointer)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  local_88._16_8_ = &std::cerr;
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8," -> done\n","");
  uVar2 = local_88._8_8_;
  strlen((char *)local_88._8_8_);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,uVar2);
  psVar7 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar7) {
    local_f0._16_8_ = *psVar7;
    local_f0._24_8_ = plVar4[3];
    local_f0._0_8_ = pcVar1;
  }
  else {
    local_f0._16_8_ = *psVar7;
    local_f0._0_8_ = (size_type *)*plVar4;
  }
  local_f0._8_8_ = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
            (local_100.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<std::__cxx11::string>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)
             (local_88 + 0x10),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
  if ((pointer)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  if (local_70.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.impl_.
               super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_60.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.impl_.
               super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_98.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.impl_.
               super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_a8.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.impl_.
               super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_100.executor_.impl_.
      super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.executor_.impl_.
               super___shared_ptr<nrg::detail::AsyncQueue<nrg::TimedExecution>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void test1(const char* title)
{
    nrg::Executor<ExecutionMode> ex(onError);
    int i = 42;
    ex(print<std::string>, std::ref(std::cerr), title + std::string(" -> start"));
    ex(print2, ++i, "hallo1");
    ex(print2, ++i, "hallo2");
    ex(print2, ++i, "hallo3");
    ex(print2, ++i, "hallo4");
    ex(print2, ++i, "hallo5");
    ex(print2, ++i, "hallo6");

    ex(exception);

    nrg::AsyncResult<int> ar1;
    nrg::AsyncResult<int> ar2;
    nrg::AsyncResult<int> ar3;

    ex(withResult, ar1, ar2, ar3, 42);
    int res1 = ar1.getResult();
    int res2 = ar2.getResult(std::chrono::milliseconds(0), 43);
    std::experimental::optional<int> res3 = ar3.getResult(std::chrono::milliseconds(0));
    std::cerr <<  "ar1: " <<  res1 << ",  ar2: " << res2 << ",  res3: " << (res3 ? *res3 : 0) << "\n";

    auto t1 = now();

    nrg::AsyncResult<int> ar4;
    ex(roundTrip, ar4);
    ar4.getResult(std::chrono::milliseconds(200), 99);
    auto dur = now()-t1;
    std::cout <<  "ar4 duration: " << std::chrono::duration_cast<std::chrono::nanoseconds>(dur).count() << " ns\n";

    ex(print<int>, std::ref(std::cerr), 251);
    ex(print<int>, std::ref(std::cerr), 252);
    ex(print<int>, std::ref(std::cerr), 253);
    ex(print<int>, std::ref(std::cerr), 254);
    ex(print<int>, std::ref(std::cerr), 255);
    ex(print<int>, std::ref(std::cerr), 256);
    ex(TimedCaller("no timeout"));
    ex(print<std::string>, std::ref(std::cerr), title + std::string(" -> done\n"));

    //std::this_thread::sleep_for(std::chrono::milliseconds(1000));
}